

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

void __thiscall JitFFI::SysV64::ArgOPList::add(ArgOPList *this,uint id,OP op,uint num)

{
  Data local_28;
  uint local_1c;
  OP local_15;
  uint num_local;
  OP op_local;
  ArgOPList *pAStack_10;
  uint id_local;
  ArgOPList *this_local;
  
  local_1c = num;
  local_15 = op;
  num_local = id;
  pAStack_10 = this;
  if (op != op_struct) {
    ArgOPCounter::add(&this->counter,op);
    local_28.op = local_15;
    local_28.id = num_local;
    local_28.num = local_1c;
    StackList<JitFFI::SysV64::ArgOPList::Data>::add(&this->datalist,&local_28);
    return;
  }
  __assert_fail("op != ArgTypeInfo::op_struct",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                ,0x259,
                "void JitFFI::SysV64::ArgOPList::add(unsigned int, ArgTypeInfo::OP, unsigned int)");
}

Assistant:

void add(unsigned int id, ArgTypeInfo::OP op, unsigned int num = 0) {
				assert(op != ArgTypeInfo::op_struct);
				counter.add(op);
				datalist.add({ op, id, num });
			}